

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::anon_unknown_1::readInt2101010Rev<float>(Vector<float,_4> *dst,int size,void *ptr)

{
  deInt32 dVar1;
  float *pfVar2;
  uint local_24;
  void *pvStack_20;
  deUint32 aligned;
  void *ptr_local;
  Vector<float,_4> *pVStack_10;
  int size_local;
  Vector<float,_4> *dst_local;
  
  pvStack_20 = ptr;
  ptr_local._4_4_ = size;
  pVStack_10 = dst;
  ::deMemcpy(&local_24,ptr,4);
  dVar1 = extendSign<10>(local_24 & 0x3ff);
  pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,0);
  *pfVar2 = (float)dVar1;
  if (1 < ptr_local._4_4_) {
    dVar1 = extendSign<10>(local_24 >> 10 & 0x3ff);
    pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,1);
    *pfVar2 = (float)dVar1;
  }
  if (2 < ptr_local._4_4_) {
    dVar1 = extendSign<10>(local_24 >> 0x14 & 0x3ff);
    pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,2);
    *pfVar2 = (float)dVar1;
  }
  if (3 < ptr_local._4_4_) {
    dVar1 = extendSign<2>(local_24 >> 0x1e);
    pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,3);
    *pfVar2 = (float)dVar1;
  }
  return;
}

Assistant:

inline void readInt2101010Rev (typename tcu::Vector<DstScalarType, 4>& dst, const int size, const void* ptr)
{
	deUint32 aligned;
	deMemcpy(&aligned, ptr, sizeof(deUint32));

				   dst[0] = (DstScalarType)extendSign<10>((aligned >>  0) & ((1 << 10) - 1));
	if (size >= 2) dst[1] = (DstScalarType)extendSign<10>((aligned >> 10) & ((1 << 10) - 1));
	if (size >= 3) dst[2] = (DstScalarType)extendSign<10>((aligned >> 20) & ((1 << 10) - 1));
	if (size >= 4) dst[3] = (DstScalarType)extendSign< 2>((aligned >> 30) & ((1 <<  2) - 1));
}